

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O1

void __thiscall
llbuild::buildsystem::BuildFile::BuildFile
          (BuildFile *this,StringRef mainFilename,BuildFileDelegate *delegate)

{
  string *psVar1;
  char *pcVar2;
  
  pcVar2 = mainFilename.Data;
  psVar1 = (string *)operator_new(0xd0);
  *(string **)psVar1 = psVar1 + 0x10;
  if (pcVar2 == (char *)0x0) {
    *(undefined8 *)(psVar1 + 8) = 0;
    psVar1[0x10] = (string)0x0;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>(psVar1,pcVar2,pcVar2 + mainFilename.Length);
  }
  *(BuildFileDelegate **)(psVar1 + 0x20) = delegate;
  *(undefined8 *)(psVar1 + 0x28) = 0;
  *(undefined8 *)(psVar1 + 0x30) = 0;
  *(undefined8 *)(psVar1 + 0x38) = 0x1000000000;
  *(undefined8 *)(psVar1 + 0x48) = 0;
  *(undefined8 *)(psVar1 + 0x50) = 0;
  *(undefined8 *)(psVar1 + 0x58) = 0x1000000000;
  *(string **)(psVar1 + 0x68) = psVar1 + 0x78;
  *(undefined8 *)(psVar1 + 0x70) = 0;
  psVar1[0x78] = (string)0x0;
  *(undefined8 *)(psVar1 + 0x88) = 0;
  *(undefined8 *)(psVar1 + 0x90) = 0;
  *(undefined8 *)(psVar1 + 0x98) = 0x1000000000;
  *(undefined8 *)(psVar1 + 0xa8) = 0;
  *(undefined8 *)(psVar1 + 0xb0) = 0;
  *(undefined8 *)(psVar1 + 0xb8) = 0x1000000000;
  psVar1[200] = (string)0x0;
  *(undefined4 *)(psVar1 + 0xcc) = 0;
  this->impl = psVar1;
  return;
}

Assistant:

BuildFile::BuildFile(StringRef mainFilename,
                     BuildFileDelegate& delegate)
  : impl(new BuildFileImpl(*this, mainFilename, delegate))
{
}